

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

bool __thiscall
tetgenmesh::tetalldihedral
          (tetgenmesh *this,point pa,point pb,point pc,point pd,double *cosdd,double *cosmaxd,
          double *cosmind)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  double (*N_00) [3];
  ulong uVar5;
  double dVar6;
  double dVar7;
  double N [4] [3];
  double vol;
  double local_98 [12];
  double local_38;
  
  local_38 = 0.0;
  N_00 = (double (*) [3])local_98;
  tetallnormal(this,pa,pb,pc,pd,N_00,&local_38);
  dVar6 = local_38;
  if (0.0 < local_38) {
    pdVar2 = local_98;
    lVar3 = 0;
    do {
      dVar7 = SQRT(local_98[lVar3 * 3 + 2] * local_98[lVar3 * 3 + 2] +
                   local_98[lVar3 * 3] * local_98[lVar3 * 3] +
                   local_98[lVar3 * 3 + 1] * local_98[lVar3 * 3 + 1]);
      if ((dVar7 != 0.0) || (dVar1 = 0.0, NAN(dVar7))) {
        lVar4 = 0;
        do {
          pdVar2[lVar4] = pdVar2[lVar4] / dVar7;
          lVar4 = lVar4 + 1;
          dVar1 = dVar6;
        } while (lVar4 != 3);
      }
      dVar6 = dVar1;
      lVar3 = lVar3 + 1;
      pdVar2 = pdVar2 + 3;
    } while (lVar3 != 4);
  }
  if (dVar6 <= 0.0) {
    lVar3 = 0;
    facenormal(this,pc,pb,pd,(double *)N_00,1,(double *)0x0);
    facenormal(this,pa,pc,pd,local_98 + 3,1,(double *)0x0);
    facenormal(this,pb,pa,pd,local_98 + 6,1,(double *)0x0);
    facenormal(this,pa,pb,pc,local_98 + 9,1,(double *)0x0);
    do {
      dVar6 = SQRT(local_98[lVar3 * 3 + 2] * local_98[lVar3 * 3 + 2] +
                   local_98[lVar3 * 3] * local_98[lVar3 * 3] +
                   local_98[lVar3 * 3 + 1] * local_98[lVar3 * 3 + 1]);
      if ((dVar6 == 0.0) && (!NAN(dVar6))) {
        if (cosdd != (double *)0x0) {
          lVar3 = 0;
          do {
            cosdd[lVar3] = -1.0;
            (cosdd + lVar3)[1] = -1.0;
            lVar3 = lVar3 + 2;
          } while (lVar3 != 6);
        }
        if (cosmaxd != (double *)0x0) {
          *cosmaxd = -1.0;
        }
        if (cosmind != (double *)0x0) {
          *cosmind = -1.0;
        }
        return false;
      }
      lVar4 = 0;
      do {
        (*N_00)[lVar4] = (*N_00)[lVar4] / dVar6;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      lVar3 = lVar3 + 1;
      N_00 = N_00 + 1;
    } while (lVar3 != 4);
  }
  lVar3 = 0;
  do {
    dVar6 = local_98[2] * local_98[5] + local_98[0] * local_98[3] + local_98[1] * local_98[4];
    uVar5 = -(ulong)(1.0 < dVar6);
    dVar7 = (double)(uVar5 & 0xbff0000000000000 | ~uVar5 & (ulong)-dVar6);
    dVar6 = 1.0;
    if (dVar7 <= 1.0) {
      dVar6 = dVar7;
    }
    if (cosdd != (double *)0x0) {
      cosdd[lVar3] = dVar6;
    }
    if (cosmaxd != (double *)0x0 || cosmind != (double *)0x0) {
      if (lVar3 == 0) {
        if (cosmaxd != (double *)0x0) {
          *cosmaxd = dVar6;
        }
        if (cosmind != (double *)0x0) goto LAB_00113950;
      }
      else {
        if (cosmaxd != (double *)0x0) {
          dVar7 = dVar6;
          if (*cosmaxd <= dVar6) {
            dVar7 = *cosmaxd;
          }
          *cosmaxd = dVar7;
        }
        if (cosmind != (double *)0x0) {
          if (dVar6 <= *cosmind) {
            dVar6 = *cosmind;
          }
LAB_00113950:
          *cosmind = dVar6;
        }
      }
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 6) {
      return true;
    }
  } while( true );
}

Assistant:

bool tetgenmesh::tetalldihedral(point pa, point pb, point pc, point pd,
                                REAL* cosdd, REAL* cosmaxd, REAL* cosmind)
{
  REAL N[4][3], vol, cosd, len;
  int f1 = 0, f2 = 0, i, j;

  vol = 0; // Check if the tet is valid or not.

  // Get four normals of faces of the tet.
  tetallnormal(pa, pb, pc, pd, N, &vol);

  if (vol > 0) {
    // Normalize the normals.
    for (i = 0; i < 4; i++) {
      len = sqrt(dot(N[i], N[i]));
      if (len != 0.0) {
        for (j = 0; j < 3; j++) N[i][j] /= len;
      } else {
        // There are degeneracies, such as duplicated vertices.
        vol = 0; //assert(0);
      }
    }
  }

  if (vol <= 0) { // if (vol == 0.0) {
    // A degenerated tet or an inverted tet.
    facenormal(pc, pb, pd, N[0], 1, NULL);
    facenormal(pa, pc, pd, N[1], 1, NULL);
    facenormal(pb, pa, pd, N[2], 1, NULL);
    facenormal(pa, pb, pc, N[3], 1, NULL);
    // Normalize the normals.
    for (i = 0; i < 4; i++) {
      len = sqrt(dot(N[i], N[i]));
      if (len != 0.0) {
        for (j = 0; j < 3; j++) N[i][j] /= len;
      } else {
        // There are degeneracies, such as duplicated vertices.
        break; // Not a valid normal.
      }
    }
    if (i < 4) {
      // Do not calculate dihedral angles.
      // Set all angles be 0 degree. There will be no quality optimization for
      //   this tet! Use volume optimization to correct it.
      if (cosdd != NULL) {
        for (i = 0; i < 6; i++) {
          cosdd[i] = -1.0; // 180 degree.
        }
      }
      // This tet has zero volume.
      if (cosmaxd != NULL) {
        *cosmaxd = -1.0; // 180 degree.
      }
      if (cosmind != NULL) {
        *cosmind = -1.0; // 180 degree.
      }
      return false;
    }
  }

  // Calculate the cosine of the dihedral angles of the edges.
  for (i = 0; i < 6; i++) {
    switch (i) {
    case 0: f1 = 0; f2 = 1; break; // [c,d].
    case 1: f1 = 1; f2 = 2; break; // [a,d].
    case 2: f1 = 2; f2 = 3; break; // [a,b].
    case 3: f1 = 0; f2 = 3; break; // [b,c].
    case 4: f1 = 2; f2 = 0; break; // [b,d].
    case 5: f1 = 1; f2 = 3; break; // [a,c].
    }
    cosd = -dot(N[f1], N[f2]);
    if (cosd < -1.0) cosd = -1.0; // Rounding.
    if (cosd >  1.0) cosd =  1.0; // Rounding.
    if (cosdd) cosdd[i] = cosd;
    if (cosmaxd || cosmind) {
      if (i == 0) {
        if (cosmaxd) *cosmaxd = cosd;
        if (cosmind) *cosmind = cosd;
      } else {
        if (cosmaxd) *cosmaxd = cosd < *cosmaxd ? cosd : *cosmaxd;
        if (cosmind) *cosmind = cosd > *cosmind ? cosd : *cosmind;
      }
    }
  }

  return true;
}